

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

TryTable * __thiscall
wasm::Builder::makeTryTable
          (Builder *this,Expression *body,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchDests,
          vector<bool,_std::allocator<bool>_> *catchRefs,optional<wasm::Type> type)

{
  TryTable *pTVar1;
  MixedArena *this_00;
  
  this_00 = (MixedArena *)(this->wasm + 0x200);
  pTVar1 = (TryTable *)MixedArena::allocSpace(this_00,0x98,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id = TryTableId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id = 0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements =
       0;
  (pTVar1->catchTags).allocator = this_00;
  (pTVar1->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0
  ;
  (pTVar1->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pTVar1->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
       = 0;
  (pTVar1->catchDests).allocator = this_00;
  (pTVar1->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data = (bool *)0x0;
  (pTVar1->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements = 0;
  (pTVar1->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.allocatedElements = 0;
  (pTVar1->catchRefs).allocator = this_00;
  (pTVar1->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0;
  (pTVar1->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
  (pTVar1->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements =
       0;
  (pTVar1->sentTypes).allocator = this_00;
  pTVar1->body = body;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchTags,catchTags);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchDests,catchDests);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&pTVar1->catchRefs,catchRefs);
  wasm::TryTable::finalize
            (pTVar1,type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload,
             type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._8_4_,this->wasm);
  return pTVar1;
}

Assistant:

TryTable* makeTryTable(Expression* body,
                         const std::vector<Name>& catchTags,
                         const std::vector<Name>& catchDests,
                         const std::vector<bool>& catchRefs,
                         std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<TryTable>();
    ret->body = body;
    ret->catchTags.set(catchTags);
    ret->catchDests.set(catchDests);
    ret->catchRefs.set(catchRefs);
    ret->finalize(type, &wasm);
    return ret;
  }